

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mondata.c
# Opt level: O0

boolean can_blnd(monst *magr,monst *mdef,uchar aatyp,obj *obj)

{
  bool bVar1;
  boolean bVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  obj *local_58;
  char *s;
  obj *o;
  boolean check_visor;
  boolean is_you;
  obj *obj_local;
  uchar aatyp_local;
  monst *mdef_local;
  monst *magr_local;
  
  bVar5 = mdef == &youmonst;
  bVar1 = false;
  if ((mdef->data->mflags1 & 0x1000) != 0) {
    return '\0';
  }
  uVar3 = (uint)aatyp;
  if (uVar3 != 0) {
    if (uVar3 == 1) {
      if ((bVar5) && (ublindf != (obj *)0x0)) {
        return '\0';
      }
      if ((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) {
        return '\0';
      }
      bVar1 = true;
      goto LAB_00250cf5;
    }
    if (uVar3 - 5 < 2) {
      if ((magr != (monst *)0x0) && ((*(uint *)&magr->field_0x60 >> 8 & 1) != 0)) {
        return '\0';
      }
      goto LAB_00250cf5;
    }
    if (uVar3 != 10) {
      if (uVar3 == 0xb) {
        if ((bVar5) &&
           ((((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) || (u.usleep != 0)) ||
            (u.ucreamed != 0)))) {
          return '\0';
        }
        if ((!bVar5) && ((*(uint *)&mdef->field_0x60 >> 0x13 & 1) != 0)) {
          return '\0';
        }
        goto LAB_00250cf5;
      }
      if (uVar3 - 0xc < 4) {
LAB_00250ad4:
        if ((magr != (monst *)0x0) && ((*(uint *)&magr->field_0x60 >> 8 & 1) != 0)) {
          return '\0';
        }
        bVar2 = resists_blnd(mdef);
        return (bVar2 != '\0' ^ 0xffU) & 1;
      }
      if (uVar3 != 0xfe) {
        if (uVar3 != 0xff) goto LAB_00250cf5;
        goto LAB_00250ad4;
      }
    }
  }
  if ((obj == (obj *)0x0) || (obj->otyp != 0x120)) {
    if ((obj == (obj *)0x0) || (obj->otyp != 0x218)) {
      if ((obj != (obj *)0x0) && (obj->otyp == 0x133)) {
        return '\x01';
      }
      return '\0';
    }
    if ((bVar5) && ((ublindf != (obj *)0x0 || (u.ucreamed != 0)))) {
      return '\0';
    }
    bVar1 = true;
  }
  else if (((bVar5) && (ublindf != (obj *)0x0)) && (ublindf->otyp != 0xed)) {
    return '\0';
  }
  if ((magr == &youmonst) && ((u._1052_1_ & 1) != 0)) {
    return '\0';
  }
LAB_00250cf5:
  if (bVar1) {
    if (mdef == &youmonst) {
      local_58 = invent;
    }
    else {
      local_58 = mdef->minvent;
    }
    for (s = (char *)local_58; s != (char *)0x0; s = *(char **)s) {
      if ((((*(uint *)(s + 0x60) & 4) != 0) &&
          (obj_descr[objects[*(short *)(s + 0x2a)].oc_descr_idx].oc_descr != (char *)0x0)) &&
         (iVar4 = strcmp(obj_descr[objects[*(short *)(s + 0x2a)].oc_descr_idx].oc_descr,
                         "visored helmet"), iVar4 == 0)) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

boolean can_blnd(struct monst *magr,	/* NULL == no specific aggressor */
		 struct monst *mdef,
		 uchar aatyp,
		 struct obj *obj)	/* aatyp == AT_WEAP, AT_SPIT */
{
	boolean is_you = (mdef == &youmonst);
	boolean check_visor = FALSE;
	struct obj *o;
	const char *s;

	/* no eyes protect against all attacks for now */
	if (!haseyes(mdef->data))
	    return FALSE;

	switch(aatyp) {
	case AT_EXPL: case AT_BOOM: case AT_GAZE: case AT_MAGC:
	case AT_BREA: /* assumed to be lightning */
	    /* light-based attacks may be cancelled or resisted */
	    if (magr && magr->mcan)
		return FALSE;
	    return !resists_blnd(mdef);

	case AT_WEAP: case AT_SPIT: case AT_NONE:
	    /* an object is used (thrown/spit/other) */
	    if (obj && (obj->otyp == CREAM_PIE)) {
		if (is_you && Blindfolded)
		    return FALSE;
	    } else if (obj && (obj->otyp == BLINDING_VENOM)) {
		/* all ublindf, including LENSES, protect, cream-pies too */
		if (is_you && (ublindf || u.ucreamed))
		    return FALSE;
		check_visor = TRUE;
	    } else if (obj && (obj->otyp == POT_BLINDNESS)) {
		return TRUE;	/* no defense */
	    } else
		return FALSE;	/* other objects cannot cause blindness yet */
	    if ((magr == &youmonst) && u.uswallow)
		return FALSE;	/* can't affect eyes while inside monster */
	    break;

	case AT_ENGL:
	    if (is_you && (Blindfolded || u.usleep || u.ucreamed))
		return FALSE;
	    if (!is_you && mdef->msleeping)
		return FALSE;
	    break;

	case AT_CLAW:
	    /* e.g. raven: all ublindf, including LENSES, protect */
	    if (is_you && ublindf)
		return FALSE;
	    if ((magr == &youmonst) && u.uswallow)
		return FALSE;	/* can't affect eyes while inside monster */
	    check_visor = TRUE;
	    break;

	case AT_TUCH: case AT_STNG:
	    /* some physical, blind-inducing attacks can be cancelled */
	    if (magr && magr->mcan)
		return FALSE;
	    break;

	default:
	    break;
	}

	/* check if wearing a visor (only checked if visor might help) */
	if (check_visor) {
	    o = (mdef == &youmonst) ? invent : mdef->minvent;
	    for ( ; o; o = o->nobj)
		if ((o->owornmask & W_ARMH) &&
		    (s = OBJ_DESCR(objects[o->otyp])) != NULL &&
		    !strcmp(s, "visored helmet"))
		    return FALSE;
	}

	return TRUE;
}